

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_clear_free(BIGNUM *a)

{
  int iVar1;
  int i;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (a != (BIGNUM *)0x0) {
    if (a->d != (ulong *)0x0) {
      CRYPTO_memzero((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8);
      iVar1 = BN_get_flags((BIGNUM *)a,2);
      if (iVar1 == 0) {
        bn_free_d((BIGNUM *)0x114ff6);
      }
    }
    iVar1 = BN_get_flags((BIGNUM *)a,1);
    CRYPTO_memzero((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      CRYPTO_free(a);
    }
  }
  return;
}

Assistant:

void BN_clear_free(BIGNUM *a)
{
    int i;

    if (a == NULL)
        return;
    bn_check_top(a);
    if (a->d != NULL) {
        CRYPTO_memzero(a->d, a->dmax * sizeof(a->d[0]));
        if (!BN_get_flags(a, BN_FLG_STATIC_DATA))
            bn_free_d(a);
    }
    i = BN_get_flags(a, BN_FLG_MALLOCED);
    CRYPTO_memzero(a, sizeof(*a));
    if (i)
        CRYPTO_free(a);
}